

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

LZ4_stream_t * LZ4_createStream(void)

{
  LZ4_stream_t *lz4s;
  
  lz4s = (LZ4_stream_t *)malloc(0x4020);
  if (lz4s == (LZ4_stream_t *)0x0) {
    lz4s = (LZ4_stream_t *)0x0;
  }
  else {
    LZ4_initStream(lz4s,0x4020);
  }
  return lz4s;
}

Assistant:

LZ4_stream_t* LZ4_createStream(void)
{
    LZ4_stream_t* const lz4s = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));
    LZ4_STATIC_ASSERT(LZ4_STREAMSIZE >= sizeof(LZ4_stream_t_internal));    /* A compilation error here means LZ4_STREAMSIZE is not large enough */
    DEBUGLOG(4, "LZ4_createStream %p", lz4s);
    if (lz4s == NULL) return NULL;
    LZ4_initStream(lz4s, sizeof(*lz4s));
    return lz4s;
}